

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGuiStb::STB_TEXTEDIT_DELETECHARS(ImGuiInputTextState *obj,int pos,int n)

{
  ImWchar IVar1;
  int iVar2;
  ImWchar *pIVar3;
  ImWchar *in_text;
  
  in_text = (obj->TextW).Data + pos;
  iVar2 = ImTextCountUtf8BytesFromStr(in_text,in_text + n);
  obj->CurLenA = obj->CurLenA - iVar2;
  obj->CurLenW = obj->CurLenW - n;
  pIVar3 = (obj->TextW).Data + (long)pos + (long)n;
  do {
    IVar1 = *pIVar3;
    if (IVar1 != 0) {
      *in_text = IVar1;
      in_text = in_text + 1;
    }
    pIVar3 = pIVar3 + 1;
  } while (IVar1 != 0);
  *in_text = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->TextW.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text (FIXME-OPT: Use memmove)
    const ImWchar* src = obj->TextW.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}